

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.hpp
# Opt level: O1

enable_if_type<_std::is_void<result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>_>
* __thiscall
bm::GenericBench<std::chrono::_V2::steady_clock>::
mark<std::_Mem_fn<bool(Configuration::*)(std::__cxx11::string_const&)>,Configuration*,std::__cxx11::string&>
          (enable_if_type<_std::is_void<result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<_Mem_fn<bool_(Configuration::*)(const_basic_string<char>_&)>_&&(Configuration_*&&,_basic_string<char>_&)>_>_>
           *__return_storage_ptr__,GenericBench<std::chrono::_V2::steady_clock> *this,
          _Mem_fn<bool_(Configuration::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *func,Configuration **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  overflow_callback *__x;
  bool bVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  Mark mark;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  Mark local_70;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  pcVar3 = *(code **)this;
  plVar5 = (long *)((func->
                    super__Mem_fn_base<bool_(Configuration::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_true>
                    )._M_pmf + *(long *)(this + 8));
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *plVar5 + -1);
  }
  bVar1 = (bool)(*pcVar3)(plVar5,args);
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_78.__r = lVar4 - lVar2;
  Mark::Mark<long,std::ratio<1l,1000000000l>>(&local_70,&local_78);
  (__return_storage_ptr__->first)._total.__r = local_70._total.__r;
  (__return_storage_ptr__->first)._iterations = local_70._iterations;
  (__return_storage_ptr__->first)._min.__r = local_70._min.__r;
  (__return_storage_ptr__->first)._max.__r = local_70._max.__r;
  __x = &local_70._overflow_callback;
  std::function<void_(const_bm::Mark_&)>::function
            (&(__return_storage_ptr__->first)._overflow_callback,__x);
  __return_storage_ptr__->second = bVar1;
  if (local_70._overflow_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70._overflow_callback.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

static auto mark(Func&& func, Args&&... args)
        -> enable_if_type< !std::is_void<result_type<Func&&(Args&&...)>>::value,
                           std::pair<Mark, result_type<Func&&(Args&&...)>> >
    {
        auto before = Clock::now();
        auto result = std::forward<Func>(func)(std::forward<Args>(args)...);
        auto after = Clock::now();
        auto mark = Mark(after - before);
        return std::make_pair(mark, result);
    }